

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O1

UBool ulist_removeString_63(UList *list,char *data)

{
  UListNode *__s2;
  UList *pUVar1;
  int iVar2;
  UList *pUVar3;
  UList *pUVar4;
  UList *buffer;
  
  buffer = list;
  if (list != (UList *)0x0) {
    do {
      buffer = (UList *)buffer->head;
      if (buffer == (UList *)0x0) {
        return '\0';
      }
      __s2 = buffer->curr;
      iVar2 = strcmp(data,(char *)__s2);
    } while (iVar2 != 0);
    pUVar1 = (UList *)buffer->tail;
    pUVar3 = pUVar1;
    if (pUVar1 == (UList *)0x0) {
      pUVar3 = list;
    }
    pUVar3->head = buffer->head;
    pUVar3 = (UList *)buffer->head;
    pUVar4 = pUVar3;
    if (pUVar3 == (UList *)0x0) {
      pUVar4 = list;
    }
    pUVar4->tail = (UListNode *)pUVar1;
    if ((UList *)list->curr == buffer) {
      list->curr = (UListNode *)pUVar3;
    }
    list->size = list->size + -1;
    if ((char)buffer->size != '\0') {
      uprv_free_63(__s2);
    }
    uprv_free_63(buffer);
    if (buffer != (UList *)0x0) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2 ulist_removeString(UList *list, const char *data) {
    if (list != NULL) {
        UListNode *pointer;
        for (pointer = list->head; pointer != NULL; pointer = pointer->next) {
            if (uprv_strcmp(data, (const char *)pointer->data) == 0) {
                ulist_removeItem(list, pointer);
                // Remove only the first occurrence, like Java LinkedList.remove(Object).
                return TRUE;
            }
        }
    }
    return FALSE;
}